

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    iVar1 = pObj->Id;
    if ((long)iVar1 < 0) goto LAB_00565c65;
    iVar2 = p->vMapping->nSize;
    if (iVar2 <= iVar1) goto LAB_00565c65;
    iVar1 = p->vMapping->pArray[iVar1];
    if (iVar1 == 0) {
LAB_00565ca3:
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x36d,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    if ((iVar1 < 0) || (iVar2 <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    if (iVar1 == 0) goto LAB_00565ca3;
  }
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vId2Num->nSize)) {
    iVar1 = p->vId2Num->pArray[iVar1];
    if ((long)iVar1 < 0) {
      __assert_fail("ObjNum >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x36f,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    if ((iFrame < 0) || (p->vId2Var->nSize <= iFrame)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar3 = p->vId2Var->pArray[(uint)iFrame];
    if (pvVar3 == (void *)0x0) {
      __assert_fail("vFrame != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x371,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    if (iVar1 < *(int *)((long)pvVar3 + 4)) {
      return *(int *)(*(long *)((long)pvVar3 + 8) + (long)iVar1 * 4);
    }
  }
LAB_00565c65:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Saig_ManBmcLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    assert( ObjNum >= 0 );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    assert( vFrame != NULL );
    return Vec_IntEntry( vFrame, ObjNum );
}